

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<4,_1,_true,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  Geometry *pGVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 (*pauVar32) [16];
  uint uVar33;
  uint uVar34;
  undefined1 (*pauVar35) [16];
  long lVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  Scene *pSVar43;
  RTCRayQueryContext *pRVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  undefined4 uVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [32];
  undefined1 auVar73 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  float fVar95;
  float fVar96;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar101;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar104 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  float fVar121;
  float fVar124;
  float fVar125;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  float fVar128;
  float fVar130;
  float fVar131;
  undefined1 auVar129 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_1534;
  RTCFilterFunctionNArguments local_1530;
  undefined1 local_1500 [32];
  undefined1 local_14e0 [8];
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  long local_1470;
  ulong local_1468;
  undefined1 local_1460 [32];
  float local_1430;
  float local_142c;
  float local_1428;
  undefined4 local_1424;
  undefined4 local_1420;
  undefined4 local_141c;
  uint local_1418;
  uint local_1414;
  uint local_1410;
  undefined1 local_1400 [32];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [32];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  float local_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  float local_1340;
  float fStack_133c;
  float fStack_1338;
  float fStack_1334;
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined1 local_12e0 [16];
  undefined4 uStack_12d0;
  undefined4 uStack_12cc;
  undefined4 uStack_12c8;
  undefined4 uStack_12c4;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined4 local_10e0;
  undefined4 uStack_10dc;
  undefined4 uStack_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined4 uStack_10c8;
  undefined4 uStack_10c4;
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  float fVar67;
  float fVar68;
  float fVar69;
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 != 8) {
    pauVar35 = (undefined1 (*) [16])local_f90;
    uStack_f98 = 0;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar54 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar59 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar80._8_4_ = 0x7fffffff;
    auVar80._0_8_ = 0x7fffffff7fffffff;
    auVar80._12_4_ = 0x7fffffff;
    auVar80 = vandps_avx((undefined1  [16])aVar3,auVar80);
    auVar89._8_4_ = 0x219392ef;
    auVar89._0_8_ = 0x219392ef219392ef;
    auVar89._12_4_ = 0x219392ef;
    auVar80 = vcmpps_avx(auVar80,auVar89,1);
    auVar90._8_4_ = 0x3f800000;
    auVar90._0_8_ = 0x3f8000003f800000;
    auVar90._12_4_ = 0x3f800000;
    auVar89 = vdivps_avx(auVar90,(undefined1  [16])aVar3);
    auVar91._8_4_ = 0x5d5e0b6b;
    auVar91._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar91._12_4_ = 0x5d5e0b6b;
    auVar80 = vblendvps_avx(auVar89,auVar91,auVar80);
    auVar81._0_4_ = auVar80._0_4_ * 0.99999964;
    auVar81._4_4_ = auVar80._4_4_ * 0.99999964;
    auVar81._8_4_ = auVar80._8_4_ * 0.99999964;
    auVar81._12_4_ = auVar80._12_4_ * 0.99999964;
    auVar70._0_4_ = auVar80._0_4_ * 1.0000004;
    auVar70._4_4_ = auVar80._4_4_ * 1.0000004;
    auVar70._8_4_ = auVar80._8_4_ * 1.0000004;
    auVar70._12_4_ = auVar80._12_4_ * 1.0000004;
    uVar48 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_1310._4_4_ = uVar48;
    local_1310._0_4_ = uVar48;
    local_1310._8_4_ = uVar48;
    local_1310._12_4_ = uVar48;
    auVar111 = ZEXT1664(local_1310);
    uVar48 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_1320._4_4_ = uVar48;
    local_1320._0_4_ = uVar48;
    local_1320._8_4_ = uVar48;
    local_1320._12_4_ = uVar48;
    auVar117 = ZEXT1664(local_1320);
    uVar48 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_1330._4_4_ = uVar48;
    local_1330._0_4_ = uVar48;
    local_1330._8_4_ = uVar48;
    local_1330._12_4_ = uVar48;
    auVar120 = ZEXT1664(local_1330);
    auVar80 = vmovshdup_avx(auVar81);
    local_1350 = vshufps_avx(auVar81,auVar81,0x55);
    auVar126 = ZEXT1664(local_1350);
    auVar89 = vshufpd_avx(auVar81,auVar81,1);
    local_1360 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar127 = ZEXT1664(local_1360);
    local_1380 = vshufps_avx(auVar70,auVar70,0x55);
    auVar133 = ZEXT1664(local_1380);
    uVar46 = (ulong)(auVar81._0_4_ < 0.0) * 0x10;
    uVar45 = (ulong)(auVar80._0_4_ < 0.0) << 4 | 0x20;
    local_1390 = vshufps_avx(auVar70,auVar70,0xaa);
    auVar135 = ZEXT1664(local_1390);
    uVar47 = (ulong)(auVar89._0_4_ < 0.0) << 4 | 0x40;
    local_1468 = uVar46 ^ 0x10;
    uVar48 = auVar54._0_4_;
    local_13d0._4_4_ = uVar48;
    local_13d0._0_4_ = uVar48;
    local_13d0._8_4_ = uVar48;
    local_13d0._12_4_ = uVar48;
    auVar104 = ZEXT1664(local_13d0);
    uVar48 = auVar59._0_4_;
    auVar53 = ZEXT1664(CONCAT412(uVar48,CONCAT48(uVar48,CONCAT44(uVar48,uVar48))));
    local_1100._16_16_ = mm_lookupmask_ps._240_16_;
    local_1100._0_16_ = mm_lookupmask_ps._0_16_;
    auVar74._8_4_ = 0x3f800000;
    auVar74._0_8_ = 0x3f8000003f800000;
    auVar74._12_4_ = 0x3f800000;
    auVar74._16_4_ = 0x3f800000;
    auVar74._20_4_ = 0x3f800000;
    auVar74._24_4_ = 0x3f800000;
    auVar74._28_4_ = 0x3f800000;
    auVar51._8_4_ = 0xbf800000;
    auVar51._0_8_ = 0xbf800000bf800000;
    auVar51._12_4_ = 0xbf800000;
    auVar51._16_4_ = 0xbf800000;
    auVar51._20_4_ = 0xbf800000;
    auVar51._24_4_ = 0xbf800000;
    auVar51._28_4_ = 0xbf800000;
    _local_1120 = vblendvps_avx(auVar74,auVar51,local_1100);
    local_1340 = auVar81._0_4_;
    fStack_133c = auVar81._0_4_;
    fStack_1338 = auVar81._0_4_;
    fStack_1334 = auVar81._0_4_;
    local_1370 = auVar70._0_4_;
    fStack_136c = auVar70._0_4_;
    fStack_1368 = auVar70._0_4_;
    fStack_1364 = auVar70._0_4_;
    fVar131 = auVar70._0_4_;
    fVar130 = auVar70._0_4_;
    fVar128 = auVar70._0_4_;
    fVar125 = auVar81._0_4_;
    fVar124 = auVar81._0_4_;
    fVar121 = auVar81._0_4_;
LAB_01929d34:
    do {
      pauVar32 = pauVar35 + -1;
      pauVar35 = pauVar35 + -1;
      if (*(float *)(*pauVar32 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar40 = *(ulong *)*pauVar35;
        while ((uVar40 & 8) == 0) {
          auVar80 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + uVar46),auVar111._0_16_);
          auVar54._0_4_ = fVar121 * auVar80._0_4_;
          auVar54._4_4_ = fVar124 * auVar80._4_4_;
          auVar54._8_4_ = fVar125 * auVar80._8_4_;
          auVar54._12_4_ = auVar81._0_4_ * auVar80._12_4_;
          auVar80 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + uVar45),auVar117._0_16_);
          auVar59._0_4_ = auVar126._0_4_ * auVar80._0_4_;
          auVar59._4_4_ = auVar126._4_4_ * auVar80._4_4_;
          auVar59._8_4_ = auVar126._8_4_ * auVar80._8_4_;
          auVar59._12_4_ = auVar126._12_4_ * auVar80._12_4_;
          auVar80 = vmaxps_avx(auVar54,auVar59);
          auVar89 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + uVar47),auVar120._0_16_);
          auVar60._0_4_ = auVar127._0_4_ * auVar89._0_4_;
          auVar60._4_4_ = auVar127._4_4_ * auVar89._4_4_;
          auVar60._8_4_ = auVar127._8_4_ * auVar89._8_4_;
          auVar60._12_4_ = auVar127._12_4_ * auVar89._12_4_;
          auVar89 = vmaxps_avx(auVar60,auVar104._0_16_);
          local_12e0 = vmaxps_avx(auVar80,auVar89);
          auVar80 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + local_1468),auVar111._0_16_);
          auVar61._0_4_ = fVar128 * auVar80._0_4_;
          auVar61._4_4_ = fVar130 * auVar80._4_4_;
          auVar61._8_4_ = fVar131 * auVar80._8_4_;
          auVar61._12_4_ = auVar70._0_4_ * auVar80._12_4_;
          auVar80 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + (uVar45 ^ 0x10)),
                               auVar117._0_16_);
          auVar71._0_4_ = auVar133._0_4_ * auVar80._0_4_;
          auVar71._4_4_ = auVar133._4_4_ * auVar80._4_4_;
          auVar71._8_4_ = auVar133._8_4_ * auVar80._8_4_;
          auVar71._12_4_ = auVar133._12_4_ * auVar80._12_4_;
          auVar80 = vminps_avx(auVar61,auVar71);
          auVar89 = vsubps_avx(*(undefined1 (*) [16])(uVar40 + 0x20 + (uVar47 ^ 0x10)),
                               auVar120._0_16_);
          auVar72._0_4_ = auVar135._0_4_ * auVar89._0_4_;
          auVar72._4_4_ = auVar135._4_4_ * auVar89._4_4_;
          auVar72._8_4_ = auVar135._8_4_ * auVar89._8_4_;
          auVar72._12_4_ = auVar135._12_4_ * auVar89._12_4_;
          auVar89 = vminps_avx(auVar72,auVar53._0_16_);
          auVar80 = vminps_avx(auVar80,auVar89);
          auVar80 = vcmpps_avx(local_12e0,auVar80,2);
          uVar38 = vmovmskps_avx(auVar80);
          if (uVar38 == 0) {
            if (pauVar35 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            goto LAB_01929d34;
          }
          uVar38 = uVar38 & 0xff;
          uVar37 = uVar40 & 0xfffffffffffffff0;
          lVar42 = 0;
          for (uVar40 = (ulong)uVar38; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000)
          {
            lVar42 = lVar42 + 1;
          }
          uVar40 = *(ulong *)(uVar37 + lVar42 * 8);
          uVar38 = uVar38 - 1 & uVar38;
          uVar39 = (ulong)uVar38;
          if (uVar38 != 0) {
            uVar34 = *(uint *)(local_12e0 + lVar42 * 4);
            lVar42 = 0;
            for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
              lVar42 = lVar42 + 1;
            }
            uVar38 = uVar38 - 1 & uVar38;
            uVar41 = (ulong)uVar38;
            uVar39 = *(ulong *)(uVar37 + lVar42 * 8);
            uVar33 = *(uint *)(local_12e0 + lVar42 * 4);
            if (uVar38 == 0) {
              if (uVar34 < uVar33) {
                *(ulong *)*pauVar35 = uVar39;
                *(uint *)(*pauVar35 + 8) = uVar33;
                pauVar35 = pauVar35 + 1;
              }
              else {
                *(ulong *)*pauVar35 = uVar40;
                *(uint *)(*pauVar35 + 8) = uVar34;
                pauVar35 = pauVar35 + 1;
                uVar40 = uVar39;
              }
            }
            else {
              auVar55._8_8_ = 0;
              auVar55._0_8_ = uVar40;
              auVar80 = vpunpcklqdq_avx(auVar55,ZEXT416(uVar34));
              auVar62._8_8_ = 0;
              auVar62._0_8_ = uVar39;
              auVar89 = vpunpcklqdq_avx(auVar62,ZEXT416(uVar33));
              lVar42 = 0;
              for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
                lVar42 = lVar42 + 1;
              }
              uVar38 = uVar38 - 1 & uVar38;
              uVar40 = (ulong)uVar38;
              auVar73._8_8_ = 0;
              auVar73._0_8_ = *(ulong *)(uVar37 + lVar42 * 8);
              auVar59 = vpunpcklqdq_avx(auVar73,ZEXT416(*(uint *)(local_12e0 + lVar42 * 4)));
              auVar54 = vpcmpgtd_avx(auVar89,auVar80);
              if (uVar38 == 0) {
                auVar90 = vpshufd_avx(auVar54,0xaa);
                auVar54 = vblendvps_avx(auVar89,auVar80,auVar90);
                auVar80 = vblendvps_avx(auVar80,auVar89,auVar90);
                auVar89 = vpcmpgtd_avx(auVar59,auVar54);
                auVar90 = vpshufd_avx(auVar89,0xaa);
                auVar89 = vblendvps_avx(auVar59,auVar54,auVar90);
                auVar54 = vblendvps_avx(auVar54,auVar59,auVar90);
                auVar59 = vpcmpgtd_avx(auVar54,auVar80);
                auVar90 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar54,auVar80,auVar90);
                auVar80 = vblendvps_avx(auVar80,auVar54,auVar90);
                *pauVar35 = auVar80;
                pauVar35[1] = auVar59;
                uVar40 = auVar89._0_8_;
                pauVar35 = pauVar35 + 2;
              }
              else {
                lVar42 = 0;
                for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                  lVar42 = lVar42 + 1;
                }
                auVar92._8_8_ = 0;
                auVar92._0_8_ = *(ulong *)(uVar37 + lVar42 * 8);
                auVar91 = vpunpcklqdq_avx(auVar92,ZEXT416(*(uint *)(local_12e0 + lVar42 * 4)));
                auVar90 = vpshufd_avx(auVar54,0xaa);
                auVar54 = vblendvps_avx(auVar89,auVar80,auVar90);
                auVar80 = vblendvps_avx(auVar80,auVar89,auVar90);
                auVar89 = vpcmpgtd_avx(auVar91,auVar59);
                auVar90 = vpshufd_avx(auVar89,0xaa);
                auVar89 = vblendvps_avx(auVar91,auVar59,auVar90);
                auVar59 = vblendvps_avx(auVar59,auVar91,auVar90);
                auVar90 = vpcmpgtd_avx(auVar59,auVar80);
                auVar91 = vpshufd_avx(auVar90,0xaa);
                auVar90 = vblendvps_avx(auVar59,auVar80,auVar91);
                auVar80 = vblendvps_avx(auVar80,auVar59,auVar91);
                auVar59 = vpcmpgtd_avx(auVar89,auVar54);
                auVar91 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar89,auVar54,auVar91);
                auVar89 = vblendvps_avx(auVar54,auVar89,auVar91);
                auVar54 = vpcmpgtd_avx(auVar90,auVar89);
                auVar91 = vpshufd_avx(auVar54,0xaa);
                auVar54 = vblendvps_avx(auVar90,auVar89,auVar91);
                auVar89 = vblendvps_avx(auVar89,auVar90,auVar91);
                *pauVar35 = auVar80;
                pauVar35[1] = auVar89;
                pauVar35[2] = auVar54;
                auVar104 = ZEXT1664(local_13d0);
                uVar40 = auVar59._0_8_;
                pauVar35 = pauVar35 + 3;
              }
            }
          }
        }
        local_1470 = (ulong)((uint)uVar40 & 0xf) - 8;
        if (local_1470 != 0) {
          uVar40 = uVar40 & 0xfffffffffffffff0;
          lVar42 = 0;
          do {
            lVar36 = lVar42 * 0xe0;
            lVar1 = uVar40 + 0xd0 + lVar36;
            local_1300 = *(undefined8 *)(lVar1 + 0x10);
            uStack_12f8 = *(undefined8 *)(lVar1 + 0x18);
            lVar1 = uVar40 + 0xc0 + lVar36;
            local_fc0 = *(undefined8 *)(lVar1 + 0x10);
            uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
            uStack_fb0 = local_fc0;
            uStack_fa8 = uStack_fb8;
            uStack_12f0 = local_1300;
            uStack_12e8 = uStack_12f8;
            auVar49._16_16_ = *(undefined1 (*) [16])(uVar40 + 0x60 + lVar36);
            auVar49._0_16_ = *(undefined1 (*) [16])(uVar40 + lVar36);
            auVar56._16_16_ = *(undefined1 (*) [16])(uVar40 + 0x70 + lVar36);
            auVar56._0_16_ = *(undefined1 (*) [16])(uVar40 + 0x10 + lVar36);
            auVar63._16_16_ = *(undefined1 (*) [16])(uVar40 + 0x80 + lVar36);
            auVar63._0_16_ = *(undefined1 (*) [16])(uVar40 + 0x20 + lVar36);
            auVar80 = *(undefined1 (*) [16])(uVar40 + 0x30 + lVar36);
            auVar75._16_16_ = auVar80;
            auVar75._0_16_ = auVar80;
            auVar80 = *(undefined1 (*) [16])(uVar40 + 0x40 + lVar36);
            auVar82._16_16_ = auVar80;
            auVar82._0_16_ = auVar80;
            auVar80 = *(undefined1 (*) [16])(uVar40 + 0x50 + lVar36);
            auVar93._16_16_ = auVar80;
            auVar93._0_16_ = auVar80;
            auVar80 = *(undefined1 (*) [16])(uVar40 + 0x90 + lVar36);
            auVar102._16_16_ = auVar80;
            auVar102._0_16_ = auVar80;
            auVar80 = *(undefined1 (*) [16])(uVar40 + 0xa0 + lVar36);
            auVar134._16_16_ = auVar80;
            auVar134._0_16_ = auVar80;
            auVar80 = *(undefined1 (*) [16])(uVar40 + 0xb0 + lVar36);
            auVar118._16_16_ = auVar80;
            auVar118._0_16_ = auVar80;
            uVar48 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar122._4_4_ = uVar48;
            auVar122._0_4_ = uVar48;
            auVar122._8_4_ = uVar48;
            auVar122._12_4_ = uVar48;
            auVar122._16_4_ = uVar48;
            auVar122._20_4_ = uVar48;
            auVar122._24_4_ = uVar48;
            auVar122._28_4_ = uVar48;
            uVar48 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar129._4_4_ = uVar48;
            auVar129._0_4_ = uVar48;
            auVar129._8_4_ = uVar48;
            auVar129._12_4_ = uVar48;
            auVar129._16_4_ = uVar48;
            auVar129._20_4_ = uVar48;
            auVar129._24_4_ = uVar48;
            auVar129._28_4_ = uVar48;
            uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar132._4_4_ = uVar2;
            auVar132._0_4_ = uVar2;
            auVar132._8_4_ = uVar2;
            auVar132._12_4_ = uVar2;
            auVar132._16_4_ = uVar2;
            auVar132._20_4_ = uVar2;
            auVar132._24_4_ = uVar2;
            auVar132._28_4_ = uVar2;
            local_1460 = vsubps_avx(auVar49,auVar122);
            local_13c0 = vsubps_avx(auVar56,auVar129);
            local_fe0 = vsubps_avx(auVar63,auVar132);
            auVar51 = vsubps_avx(auVar75,auVar122);
            local_1500 = vsubps_avx(auVar82,auVar129);
            auVar74 = vsubps_avx(auVar93,auVar132);
            auVar66 = vsubps_avx(auVar102,auVar122);
            auVar49 = vsubps_avx(auVar134,auVar129);
            auVar15 = vsubps_avx(auVar118,auVar132);
            local_1000 = vsubps_avx(auVar66,local_1460);
            local_1040 = vsubps_avx(auVar49,local_13c0);
            local_1020 = vsubps_avx(auVar15,local_fe0);
            auVar50._0_4_ = auVar66._0_4_ + local_1460._0_4_;
            auVar50._4_4_ = auVar66._4_4_ + local_1460._4_4_;
            auVar50._8_4_ = auVar66._8_4_ + local_1460._8_4_;
            auVar50._12_4_ = auVar66._12_4_ + local_1460._12_4_;
            auVar50._16_4_ = auVar66._16_4_ + local_1460._16_4_;
            auVar50._20_4_ = auVar66._20_4_ + local_1460._20_4_;
            auVar50._24_4_ = auVar66._24_4_ + local_1460._24_4_;
            auVar50._28_4_ = auVar66._28_4_ + local_1460._28_4_;
            auVar76._0_4_ = auVar49._0_4_ + local_13c0._0_4_;
            auVar76._4_4_ = auVar49._4_4_ + local_13c0._4_4_;
            auVar76._8_4_ = auVar49._8_4_ + local_13c0._8_4_;
            auVar76._12_4_ = auVar49._12_4_ + local_13c0._12_4_;
            auVar76._16_4_ = auVar49._16_4_ + local_13c0._16_4_;
            auVar76._20_4_ = auVar49._20_4_ + local_13c0._20_4_;
            auVar76._24_4_ = auVar49._24_4_ + local_13c0._24_4_;
            auVar76._28_4_ = auVar49._28_4_ + local_13c0._28_4_;
            fVar121 = local_fe0._0_4_;
            auVar83._0_4_ = auVar15._0_4_ + fVar121;
            fVar124 = local_fe0._4_4_;
            auVar83._4_4_ = auVar15._4_4_ + fVar124;
            fVar125 = local_fe0._8_4_;
            auVar83._8_4_ = auVar15._8_4_ + fVar125;
            auVar81._0_4_ = local_fe0._12_4_;
            auVar83._12_4_ = auVar15._12_4_ + auVar81._0_4_;
            fVar128 = local_fe0._16_4_;
            auVar83._16_4_ = auVar15._16_4_ + fVar128;
            fVar130 = local_fe0._20_4_;
            auVar83._20_4_ = auVar15._20_4_ + fVar130;
            fVar131 = local_fe0._24_4_;
            auVar83._24_4_ = auVar15._24_4_ + fVar131;
            auVar83._28_4_ = auVar15._28_4_ + local_fe0._28_4_;
            auVar16._4_4_ = local_1020._4_4_ * auVar76._4_4_;
            auVar16._0_4_ = local_1020._0_4_ * auVar76._0_4_;
            auVar16._8_4_ = local_1020._8_4_ * auVar76._8_4_;
            auVar16._12_4_ = local_1020._12_4_ * auVar76._12_4_;
            auVar16._16_4_ = local_1020._16_4_ * auVar76._16_4_;
            auVar16._20_4_ = local_1020._20_4_ * auVar76._20_4_;
            auVar16._24_4_ = local_1020._24_4_ * auVar76._24_4_;
            auVar16._28_4_ = uVar48;
            auVar89 = vfmsub231ps_fma(auVar16,local_1040,auVar83);
            auVar17._4_4_ = auVar83._4_4_ * local_1000._4_4_;
            auVar17._0_4_ = auVar83._0_4_ * local_1000._0_4_;
            auVar17._8_4_ = auVar83._8_4_ * local_1000._8_4_;
            auVar17._12_4_ = auVar83._12_4_ * local_1000._12_4_;
            auVar17._16_4_ = auVar83._16_4_ * local_1000._16_4_;
            auVar17._20_4_ = auVar83._20_4_ * local_1000._20_4_;
            auVar17._24_4_ = auVar83._24_4_ * local_1000._24_4_;
            auVar17._28_4_ = auVar83._28_4_;
            auVar54 = vfmsub231ps_fma(auVar17,local_1020,auVar50);
            auVar18._4_4_ = auVar50._4_4_ * local_1040._4_4_;
            auVar18._0_4_ = auVar50._0_4_ * local_1040._0_4_;
            auVar18._8_4_ = auVar50._8_4_ * local_1040._8_4_;
            auVar18._12_4_ = auVar50._12_4_ * local_1040._12_4_;
            auVar18._16_4_ = auVar50._16_4_ * local_1040._16_4_;
            auVar18._20_4_ = auVar50._20_4_ * local_1040._20_4_;
            auVar18._24_4_ = auVar50._24_4_ * local_1040._24_4_;
            auVar18._28_4_ = auVar50._28_4_;
            auVar59 = vfmsub231ps_fma(auVar18,local_1000,auVar76);
            uVar48 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            local_14a0._4_4_ = uVar48;
            local_14a0._0_4_ = uVar48;
            local_14a0._8_4_ = uVar48;
            local_14a0._12_4_ = uVar48;
            local_14a0._16_4_ = uVar48;
            local_14a0._20_4_ = uVar48;
            local_14a0._24_4_ = uVar48;
            local_14a0._28_4_ = uVar48;
            local_14e0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar19._4_4_ = (float)local_14e0._4_4_ * auVar59._4_4_;
            auVar19._0_4_ = (float)local_14e0._4_4_ * auVar59._0_4_;
            auVar19._8_4_ = (float)local_14e0._4_4_ * auVar59._8_4_;
            auVar19._12_4_ = (float)local_14e0._4_4_ * auVar59._12_4_;
            auVar19._16_4_ = (float)local_14e0._4_4_ * 0.0;
            auVar19._20_4_ = (float)local_14e0._4_4_ * 0.0;
            auVar19._24_4_ = (float)local_14e0._4_4_ * 0.0;
            auVar19._28_4_ = auVar80._12_4_;
            auVar80 = vfmadd231ps_fma(auVar19,local_14a0,ZEXT1632(auVar54));
            uVar48 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            local_14c0._4_4_ = uVar48;
            local_14c0._0_4_ = uVar48;
            local_14c0._8_4_ = uVar48;
            local_14c0._12_4_ = uVar48;
            local_14c0._16_4_ = uVar48;
            local_14c0._20_4_ = uVar48;
            local_14c0._24_4_ = uVar48;
            local_14c0._28_4_ = uVar48;
            local_12e0 = vfmadd231ps_fma(ZEXT1632(auVar80),local_14c0,ZEXT1632(auVar89));
            local_1060 = vsubps_avx(local_13c0,local_1500);
            local_10a0 = vsubps_avx(local_fe0,auVar74);
            auVar77._0_4_ = local_13c0._0_4_ + local_1500._0_4_;
            auVar77._4_4_ = local_13c0._4_4_ + local_1500._4_4_;
            auVar77._8_4_ = local_13c0._8_4_ + local_1500._8_4_;
            auVar77._12_4_ = local_13c0._12_4_ + local_1500._12_4_;
            auVar77._16_4_ = local_13c0._16_4_ + local_1500._16_4_;
            auVar77._20_4_ = local_13c0._20_4_ + local_1500._20_4_;
            auVar77._24_4_ = local_13c0._24_4_ + local_1500._24_4_;
            auVar77._28_4_ = local_13c0._28_4_ + local_1500._28_4_;
            auVar84._0_4_ = auVar74._0_4_ + fVar121;
            auVar84._4_4_ = auVar74._4_4_ + fVar124;
            auVar84._8_4_ = auVar74._8_4_ + fVar125;
            auVar84._12_4_ = auVar74._12_4_ + auVar81._0_4_;
            auVar84._16_4_ = auVar74._16_4_ + fVar128;
            auVar84._20_4_ = auVar74._20_4_ + fVar130;
            auVar84._24_4_ = auVar74._24_4_ + fVar131;
            auVar84._28_4_ = auVar74._28_4_ + local_fe0._28_4_;
            auVar70._0_4_ = local_10a0._0_4_;
            fVar69 = local_10a0._4_4_;
            auVar20._4_4_ = auVar77._4_4_ * fVar69;
            auVar20._0_4_ = auVar77._0_4_ * auVar70._0_4_;
            fVar96 = local_10a0._8_4_;
            auVar20._8_4_ = auVar77._8_4_ * fVar96;
            fVar99 = local_10a0._12_4_;
            auVar20._12_4_ = auVar77._12_4_ * fVar99;
            fVar6 = local_10a0._16_4_;
            auVar20._16_4_ = auVar77._16_4_ * fVar6;
            fVar9 = local_10a0._20_4_;
            auVar20._20_4_ = auVar77._20_4_ * fVar9;
            fVar12 = local_10a0._24_4_;
            auVar20._24_4_ = auVar77._24_4_ * fVar12;
            auVar20._28_4_ = local_1000._28_4_;
            auVar89 = vfmsub231ps_fma(auVar20,local_1060,auVar84);
            local_1080 = vsubps_avx(local_1460,auVar51);
            fVar67 = local_1080._0_4_;
            fVar88 = local_1080._4_4_;
            auVar21._4_4_ = auVar84._4_4_ * fVar88;
            auVar21._0_4_ = auVar84._0_4_ * fVar67;
            fVar97 = local_1080._8_4_;
            auVar21._8_4_ = auVar84._8_4_ * fVar97;
            fVar100 = local_1080._12_4_;
            auVar21._12_4_ = auVar84._12_4_ * fVar100;
            fVar7 = local_1080._16_4_;
            auVar21._16_4_ = auVar84._16_4_ * fVar7;
            fVar10 = local_1080._20_4_;
            auVar21._20_4_ = auVar84._20_4_ * fVar10;
            fVar13 = local_1080._24_4_;
            auVar21._24_4_ = auVar84._24_4_ * fVar13;
            auVar21._28_4_ = auVar84._28_4_;
            auVar112._0_4_ = local_1460._0_4_ + auVar51._0_4_;
            auVar112._4_4_ = local_1460._4_4_ + auVar51._4_4_;
            auVar112._8_4_ = local_1460._8_4_ + auVar51._8_4_;
            auVar112._12_4_ = local_1460._12_4_ + auVar51._12_4_;
            auVar112._16_4_ = local_1460._16_4_ + auVar51._16_4_;
            auVar112._20_4_ = local_1460._20_4_ + auVar51._20_4_;
            auVar112._24_4_ = local_1460._24_4_ + auVar51._24_4_;
            auVar112._28_4_ = local_1460._28_4_ + auVar51._28_4_;
            auVar80 = vfmsub231ps_fma(auVar21,local_10a0,auVar112);
            fVar68 = local_1060._0_4_;
            fVar95 = local_1060._4_4_;
            auVar22._4_4_ = auVar112._4_4_ * fVar95;
            auVar22._0_4_ = auVar112._0_4_ * fVar68;
            fVar98 = local_1060._8_4_;
            auVar22._8_4_ = auVar112._8_4_ * fVar98;
            fVar5 = local_1060._12_4_;
            auVar22._12_4_ = auVar112._12_4_ * fVar5;
            fVar8 = local_1060._16_4_;
            auVar22._16_4_ = auVar112._16_4_ * fVar8;
            fVar11 = local_1060._20_4_;
            auVar22._20_4_ = auVar112._20_4_ * fVar11;
            fVar14 = local_1060._24_4_;
            auVar22._24_4_ = auVar112._24_4_ * fVar14;
            auVar22._28_4_ = auVar112._28_4_;
            auVar54 = vfmsub231ps_fma(auVar22,local_1080,auVar77);
            auVar23._4_4_ = (float)local_14e0._4_4_ * auVar54._4_4_;
            auVar23._0_4_ = (float)local_14e0._4_4_ * auVar54._0_4_;
            auVar23._8_4_ = (float)local_14e0._4_4_ * auVar54._8_4_;
            auVar23._12_4_ = (float)local_14e0._4_4_ * auVar54._12_4_;
            auVar23._16_4_ = (float)local_14e0._4_4_ * 0.0;
            auVar23._20_4_ = (float)local_14e0._4_4_ * 0.0;
            auVar23._24_4_ = (float)local_14e0._4_4_ * 0.0;
            auVar23._28_4_ = auVar77._28_4_;
            auVar80 = vfmadd231ps_fma(auVar23,local_14a0,ZEXT1632(auVar80));
            auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),local_14c0,ZEXT1632(auVar89));
            auVar16 = vsubps_avx(auVar51,auVar66);
            auVar64._0_4_ = auVar51._0_4_ + auVar66._0_4_;
            auVar64._4_4_ = auVar51._4_4_ + auVar66._4_4_;
            auVar64._8_4_ = auVar51._8_4_ + auVar66._8_4_;
            auVar64._12_4_ = auVar51._12_4_ + auVar66._12_4_;
            auVar64._16_4_ = auVar51._16_4_ + auVar66._16_4_;
            auVar64._20_4_ = auVar51._20_4_ + auVar66._20_4_;
            auVar64._24_4_ = auVar51._24_4_ + auVar66._24_4_;
            auVar64._28_4_ = auVar51._28_4_ + auVar66._28_4_;
            auVar17 = vsubps_avx(local_1500,auVar49);
            auVar94._0_4_ = local_1500._0_4_ + auVar49._0_4_;
            auVar94._4_4_ = local_1500._4_4_ + auVar49._4_4_;
            auVar94._8_4_ = local_1500._8_4_ + auVar49._8_4_;
            auVar94._12_4_ = local_1500._12_4_ + auVar49._12_4_;
            auVar94._16_4_ = local_1500._16_4_ + auVar49._16_4_;
            auVar94._20_4_ = local_1500._20_4_ + auVar49._20_4_;
            auVar94._24_4_ = local_1500._24_4_ + auVar49._24_4_;
            auVar94._28_4_ = local_1500._28_4_ + auVar49._28_4_;
            auVar49 = vsubps_avx(auVar74,auVar15);
            auVar57._0_4_ = auVar74._0_4_ + auVar15._0_4_;
            auVar57._4_4_ = auVar74._4_4_ + auVar15._4_4_;
            auVar57._8_4_ = auVar74._8_4_ + auVar15._8_4_;
            auVar57._12_4_ = auVar74._12_4_ + auVar15._12_4_;
            auVar57._16_4_ = auVar74._16_4_ + auVar15._16_4_;
            auVar57._20_4_ = auVar74._20_4_ + auVar15._20_4_;
            auVar57._24_4_ = auVar74._24_4_ + auVar15._24_4_;
            auVar57._28_4_ = auVar74._28_4_ + auVar15._28_4_;
            auVar103._0_4_ = auVar49._0_4_ * auVar94._0_4_;
            auVar103._4_4_ = auVar49._4_4_ * auVar94._4_4_;
            auVar103._8_4_ = auVar49._8_4_ * auVar94._8_4_;
            auVar103._12_4_ = auVar49._12_4_ * auVar94._12_4_;
            auVar103._16_4_ = auVar49._16_4_ * auVar94._16_4_;
            auVar103._20_4_ = auVar49._20_4_ * auVar94._20_4_;
            auVar103._24_4_ = auVar49._24_4_ * auVar94._24_4_;
            auVar103._28_4_ = 0;
            auVar54 = vfmsub231ps_fma(auVar103,auVar17,auVar57);
            auVar66._4_4_ = auVar57._4_4_ * auVar16._4_4_;
            auVar66._0_4_ = auVar57._0_4_ * auVar16._0_4_;
            auVar66._8_4_ = auVar57._8_4_ * auVar16._8_4_;
            auVar66._12_4_ = auVar57._12_4_ * auVar16._12_4_;
            auVar66._16_4_ = auVar57._16_4_ * auVar16._16_4_;
            auVar66._20_4_ = auVar57._20_4_ * auVar16._20_4_;
            auVar66._24_4_ = auVar57._24_4_ * auVar16._24_4_;
            auVar66._28_4_ = auVar57._28_4_;
            auVar89 = vfmsub231ps_fma(auVar66,auVar49,auVar64);
            auVar15._4_4_ = auVar17._4_4_ * auVar64._4_4_;
            auVar15._0_4_ = auVar17._0_4_ * auVar64._0_4_;
            auVar15._8_4_ = auVar17._8_4_ * auVar64._8_4_;
            auVar15._12_4_ = auVar17._12_4_ * auVar64._12_4_;
            auVar15._16_4_ = auVar17._16_4_ * auVar64._16_4_;
            auVar15._20_4_ = auVar17._20_4_ * auVar64._20_4_;
            auVar15._24_4_ = auVar17._24_4_ * auVar64._24_4_;
            auVar15._28_4_ = auVar64._28_4_;
            auVar59 = vfmsub231ps_fma(auVar15,auVar16,auVar94);
            local_14e0._0_4_ = local_14e0._4_4_;
            fStack_14d8 = (float)local_14e0._4_4_;
            fStack_14d4 = (float)local_14e0._4_4_;
            fStack_14d0 = (float)local_14e0._4_4_;
            fStack_14cc = (float)local_14e0._4_4_;
            fStack_14c8 = (float)local_14e0._4_4_;
            fStack_14c4 = (float)local_14e0._4_4_;
            auVar65._0_4_ = (float)local_14e0._4_4_ * auVar59._0_4_;
            auVar65._4_4_ = (float)local_14e0._4_4_ * auVar59._4_4_;
            auVar65._8_4_ = (float)local_14e0._4_4_ * auVar59._8_4_;
            auVar65._12_4_ = (float)local_14e0._4_4_ * auVar59._12_4_;
            auVar65._16_4_ = (float)local_14e0._4_4_ * 0.0;
            auVar65._20_4_ = (float)local_14e0._4_4_ * 0.0;
            auVar65._24_4_ = (float)local_14e0._4_4_ * 0.0;
            auVar65._28_4_ = 0;
            auVar89 = vfmadd231ps_fma(auVar65,local_14a0,ZEXT1632(auVar89));
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),local_14c0,ZEXT1632(auVar54));
            local_12a0 = ZEXT1632(CONCAT412(auVar89._12_4_ + local_12e0._12_4_ + auVar80._12_4_,
                                            CONCAT48(auVar89._8_4_ +
                                                     local_12e0._8_4_ + auVar80._8_4_,
                                                     CONCAT44(auVar89._4_4_ +
                                                              local_12e0._4_4_ + auVar80._4_4_,
                                                              auVar89._0_4_ +
                                                              local_12e0._0_4_ + auVar80._0_4_))));
            auVar58._8_4_ = 0x7fffffff;
            auVar58._0_8_ = 0x7fffffff7fffffff;
            auVar58._12_4_ = 0x7fffffff;
            auVar58._16_4_ = 0x7fffffff;
            auVar58._20_4_ = 0x7fffffff;
            auVar58._24_4_ = 0x7fffffff;
            auVar58._28_4_ = 0x7fffffff;
            local_1500 = ZEXT1632(local_12e0);
            auVar51 = vminps_avx(local_1500,ZEXT1632(auVar80));
            auVar51 = vminps_avx(auVar51,ZEXT1632(auVar89));
            local_10c0 = vandps_avx(local_12a0,auVar58);
            fVar101 = local_10c0._0_4_ * 1.1920929e-07;
            fVar105 = local_10c0._4_4_ * 1.1920929e-07;
            auVar24._4_4_ = fVar105;
            auVar24._0_4_ = fVar101;
            fVar106 = local_10c0._8_4_ * 1.1920929e-07;
            auVar24._8_4_ = fVar106;
            fVar107 = local_10c0._12_4_ * 1.1920929e-07;
            auVar24._12_4_ = fVar107;
            fVar108 = local_10c0._16_4_ * 1.1920929e-07;
            auVar24._16_4_ = fVar108;
            fVar109 = local_10c0._20_4_ * 1.1920929e-07;
            auVar24._20_4_ = fVar109;
            fVar110 = local_10c0._24_4_ * 1.1920929e-07;
            auVar24._24_4_ = fVar110;
            auVar24._28_4_ = 0x34000000;
            auVar113._0_8_ = CONCAT44(fVar105,fVar101) ^ 0x8000000080000000;
            auVar113._8_4_ = -fVar106;
            auVar113._12_4_ = -fVar107;
            auVar113._16_4_ = -fVar108;
            auVar113._20_4_ = -fVar109;
            auVar113._24_4_ = -fVar110;
            auVar113._28_4_ = 0xb4000000;
            auVar51 = vcmpps_avx(auVar51,auVar113,5);
            auVar66 = vmaxps_avx(local_1500,ZEXT1632(auVar80));
            auVar74 = vmaxps_avx(auVar66,ZEXT1632(auVar89));
            auVar74 = vcmpps_avx(auVar74,auVar24,2);
            auVar74 = vorps_avx(auVar51,auVar74);
            if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar74 >> 0x7f,0) != '\0') ||
                  (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar74 >> 0xbf,0) != '\0') ||
                (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar74[0x1f] < '\0') {
              local_10e0 = 0x80000000;
              uStack_10dc = 0x80000000;
              uStack_10d8 = 0x80000000;
              uStack_10d4 = 0x80000000;
              uStack_10d0 = 0x80000000;
              uStack_10cc = 0x80000000;
              uStack_10c8 = 0x80000000;
              uStack_10c4 = 0x80000000;
              auVar25._4_4_ = fVar95 * local_1020._4_4_;
              auVar25._0_4_ = fVar68 * local_1020._0_4_;
              auVar25._8_4_ = fVar98 * local_1020._8_4_;
              auVar25._12_4_ = fVar5 * local_1020._12_4_;
              auVar25._16_4_ = fVar8 * local_1020._16_4_;
              auVar25._20_4_ = fVar11 * local_1020._20_4_;
              auVar25._24_4_ = fVar14 * local_1020._24_4_;
              auVar25._28_4_ = auVar51._28_4_;
              auVar26._4_4_ = local_1040._4_4_ * fVar88;
              auVar26._0_4_ = local_1040._0_4_ * fVar67;
              auVar26._8_4_ = local_1040._8_4_ * fVar97;
              auVar26._12_4_ = local_1040._12_4_ * fVar100;
              auVar26._16_4_ = local_1040._16_4_ * fVar7;
              auVar26._20_4_ = local_1040._20_4_ * fVar10;
              auVar26._24_4_ = local_1040._24_4_ * fVar13;
              auVar26._28_4_ = auVar66._28_4_;
              auVar89 = vfmsub213ps_fma(local_1040,local_10a0,auVar25);
              auVar27._4_4_ = fVar69 * auVar17._4_4_;
              auVar27._0_4_ = auVar70._0_4_ * auVar17._0_4_;
              auVar27._8_4_ = fVar96 * auVar17._8_4_;
              auVar27._12_4_ = fVar99 * auVar17._12_4_;
              auVar27._16_4_ = fVar6 * auVar17._16_4_;
              auVar27._20_4_ = fVar9 * auVar17._20_4_;
              auVar27._24_4_ = fVar12 * auVar17._24_4_;
              auVar27._28_4_ = 0x34000000;
              auVar119._0_4_ = fVar67 * auVar49._0_4_;
              auVar119._4_4_ = fVar88 * auVar49._4_4_;
              auVar119._8_4_ = fVar97 * auVar49._8_4_;
              auVar119._12_4_ = fVar100 * auVar49._12_4_;
              auVar119._16_4_ = fVar7 * auVar49._16_4_;
              auVar119._20_4_ = fVar10 * auVar49._20_4_;
              auVar119._24_4_ = fVar13 * auVar49._24_4_;
              auVar119._28_4_ = 0;
              auVar54 = vfmsub213ps_fma(auVar49,local_1060,auVar27);
              auVar51 = vandps_avx(auVar25,auVar58);
              auVar66 = vandps_avx(auVar27,auVar58);
              auVar51 = vcmpps_avx(auVar51,auVar66,1);
              local_1280 = vblendvps_avx(ZEXT1632(auVar54),ZEXT1632(auVar89),auVar51);
              auVar28._4_4_ = fVar95 * auVar16._4_4_;
              auVar28._0_4_ = fVar68 * auVar16._0_4_;
              auVar28._8_4_ = fVar98 * auVar16._8_4_;
              auVar28._12_4_ = fVar5 * auVar16._12_4_;
              auVar28._16_4_ = fVar8 * auVar16._16_4_;
              auVar28._20_4_ = fVar11 * auVar16._20_4_;
              auVar28._24_4_ = fVar14 * auVar16._24_4_;
              auVar28._28_4_ = auVar51._28_4_;
              auVar89 = vfmsub213ps_fma(auVar16,local_10a0,auVar119);
              auVar29._4_4_ = local_1000._4_4_ * fVar69;
              auVar29._0_4_ = local_1000._0_4_ * auVar70._0_4_;
              auVar29._8_4_ = local_1000._8_4_ * fVar96;
              auVar29._12_4_ = local_1000._12_4_ * fVar99;
              auVar29._16_4_ = local_1000._16_4_ * fVar6;
              auVar29._20_4_ = local_1000._20_4_ * fVar9;
              auVar29._24_4_ = local_1000._24_4_ * fVar12;
              auVar29._28_4_ = auVar66._28_4_;
              auVar54 = vfmsub213ps_fma(local_1020,local_1080,auVar29);
              auVar51 = vandps_avx(auVar29,auVar58);
              auVar66 = vandps_avx(auVar119,auVar58);
              auVar51 = vcmpps_avx(auVar51,auVar66,1);
              local_1260 = vblendvps_avx(ZEXT1632(auVar89),ZEXT1632(auVar54),auVar51);
              auVar89 = vfmsub213ps_fma(local_1000,local_1060,auVar26);
              auVar54 = vfmsub213ps_fma(auVar17,local_1080,auVar28);
              auVar51 = vandps_avx(auVar26,auVar58);
              auVar66 = vandps_avx(auVar28,auVar58);
              auVar51 = vcmpps_avx(auVar51,auVar66,1);
              local_1240 = vblendvps_avx(ZEXT1632(auVar54),ZEXT1632(auVar89),auVar51);
              auVar89 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
              fVar88 = local_1240._0_4_;
              fVar95 = local_1240._4_4_;
              auVar30._4_4_ = fVar95 * (float)local_14e0._4_4_;
              auVar30._0_4_ = fVar88 * (float)local_14e0._4_4_;
              fVar96 = local_1240._8_4_;
              auVar30._8_4_ = fVar96 * (float)local_14e0._4_4_;
              fVar97 = local_1240._12_4_;
              auVar30._12_4_ = fVar97 * (float)local_14e0._4_4_;
              fVar98 = local_1240._16_4_;
              auVar30._16_4_ = fVar98 * (float)local_14e0._4_4_;
              fVar99 = local_1240._20_4_;
              auVar30._20_4_ = fVar99 * (float)local_14e0._4_4_;
              fVar100 = local_1240._24_4_;
              auVar30._24_4_ = fVar100 * (float)local_14e0._4_4_;
              auVar30._28_4_ = auVar74._28_4_;
              auVar54 = vfmadd213ps_fma(local_14a0,local_1260,auVar30);
              auVar54 = vfmadd213ps_fma(local_14c0,local_1280,ZEXT1632(auVar54));
              auVar70._0_4_ = auVar54._0_4_ + auVar54._0_4_;
              fVar67 = auVar54._4_4_ + auVar54._4_4_;
              fVar68 = auVar54._8_4_ + auVar54._8_4_;
              fVar69 = auVar54._12_4_ + auVar54._12_4_;
              auVar66 = ZEXT1632(CONCAT412(fVar69,CONCAT48(fVar68,CONCAT44(fVar67,auVar70._0_4_))));
              auVar85._0_4_ = fVar88 * fVar121;
              auVar85._4_4_ = fVar95 * fVar124;
              auVar85._8_4_ = fVar96 * fVar125;
              auVar85._12_4_ = fVar97 * auVar81._0_4_;
              auVar85._16_4_ = fVar98 * fVar128;
              auVar85._20_4_ = fVar99 * fVar130;
              auVar85._24_4_ = fVar100 * fVar131;
              auVar85._28_4_ = 0;
              auVar54 = vfmadd213ps_fma(local_13c0,local_1260,auVar85);
              auVar59 = vfmadd213ps_fma(local_1460,local_1280,ZEXT1632(auVar54));
              auVar51 = vrcpps_avx(auVar66);
              auVar123._8_4_ = 0x3f800000;
              auVar123._0_8_ = 0x3f8000003f800000;
              auVar123._12_4_ = 0x3f800000;
              auVar123._16_4_ = 0x3f800000;
              auVar123._20_4_ = 0x3f800000;
              auVar123._24_4_ = 0x3f800000;
              auVar123._28_4_ = 0x3f800000;
              auVar54 = vfnmadd213ps_fma(auVar51,auVar66,auVar123);
              auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar51,auVar51);
              local_14a0 = ZEXT1632(CONCAT412((auVar59._12_4_ + auVar59._12_4_) * auVar54._12_4_,
                                              CONCAT48((auVar59._8_4_ + auVar59._8_4_) *
                                                       auVar54._8_4_,
                                                       CONCAT44((auVar59._4_4_ + auVar59._4_4_) *
                                                                auVar54._4_4_,
                                                                (auVar59._0_4_ + auVar59._0_4_) *
                                                                auVar54._0_4_))));
              uVar48 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar86._4_4_ = uVar48;
              auVar86._0_4_ = uVar48;
              auVar86._8_4_ = uVar48;
              auVar86._12_4_ = uVar48;
              auVar86._16_4_ = uVar48;
              auVar86._20_4_ = uVar48;
              auVar86._24_4_ = uVar48;
              auVar86._28_4_ = uVar48;
              auVar51 = vcmpps_avx(auVar86,local_14a0,2);
              fVar121 = (ray->super_RayK<1>).tfar;
              auVar114._4_4_ = fVar121;
              auVar114._0_4_ = fVar121;
              auVar114._8_4_ = fVar121;
              auVar114._12_4_ = fVar121;
              auVar114._16_4_ = fVar121;
              auVar114._20_4_ = fVar121;
              auVar114._24_4_ = fVar121;
              auVar114._28_4_ = fVar121;
              auVar74 = vcmpps_avx(local_14a0,auVar114,2);
              auVar51 = vandps_avx(auVar74,auVar51);
              auVar115._0_8_ = CONCAT44(fVar67,auVar70._0_4_) ^ 0x8000000080000000;
              auVar115._8_4_ = -fVar68;
              auVar115._12_4_ = -fVar69;
              auVar115._16_4_ = 0x80000000;
              auVar115._20_4_ = 0x80000000;
              auVar115._24_4_ = 0x80000000;
              auVar115._28_4_ = 0x80000000;
              auVar74 = vcmpps_avx(auVar115,auVar66,4);
              auVar51 = vandps_avx(auVar51,auVar74);
              auVar54 = vpackssdw_avx(auVar51._0_16_,auVar51._16_16_);
              auVar89 = vpand_avx(auVar54,auVar89);
              local_1220 = vpmovsxwd_avx2(auVar89);
              if ((((((((local_1220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1220 >> 0x7f,0) != '\0') ||
                    (local_1220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_1220 >> 0xbf,0) != '\0') ||
                  (local_1220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_1220[0x1f] < '\0') {
                uStack_12d0 = 0;
                uStack_12cc = 0;
                uStack_12c8 = 0;
                uStack_12c4 = 0;
                local_12c0 = ZEXT1632(auVar80);
                auVar51 = vrcpps_avx(local_12a0);
                auVar116._8_4_ = 0x3f800000;
                auVar116._0_8_ = 0x3f8000003f800000;
                auVar116._12_4_ = 0x3f800000;
                auVar116._16_4_ = 0x3f800000;
                auVar116._20_4_ = 0x3f800000;
                auVar116._24_4_ = 0x3f800000;
                auVar116._28_4_ = 0x3f800000;
                auVar54 = vfnmadd213ps_fma(local_12a0,auVar51,auVar116);
                auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar51,auVar51);
                auVar87._8_4_ = 0x219392ef;
                auVar87._0_8_ = 0x219392ef219392ef;
                auVar87._12_4_ = 0x219392ef;
                auVar87._16_4_ = 0x219392ef;
                auVar87._20_4_ = 0x219392ef;
                auVar87._24_4_ = 0x219392ef;
                auVar87._28_4_ = 0x219392ef;
                auVar51 = vcmpps_avx(local_10c0,auVar87,5);
                auVar51 = vandps_avx(auVar51,ZEXT1632(auVar54));
                auVar31._4_4_ = local_12e0._4_4_ * auVar51._4_4_;
                auVar31._0_4_ = local_12e0._0_4_ * auVar51._0_4_;
                auVar31._8_4_ = local_12e0._8_4_ * auVar51._8_4_;
                auVar31._12_4_ = local_12e0._12_4_ * auVar51._12_4_;
                auVar31._16_4_ = auVar51._16_4_ * 0.0;
                auVar31._20_4_ = auVar51._20_4_ * 0.0;
                auVar31._24_4_ = auVar51._24_4_ * 0.0;
                auVar31._28_4_ = 0;
                auVar74 = vminps_avx(auVar31,auVar116);
                auVar78._0_4_ = auVar80._0_4_ * auVar51._0_4_;
                auVar78._4_4_ = auVar80._4_4_ * auVar51._4_4_;
                auVar78._8_4_ = auVar80._8_4_ * auVar51._8_4_;
                auVar78._12_4_ = auVar80._12_4_ * auVar51._12_4_;
                auVar78._16_4_ = auVar51._16_4_ * 0.0;
                auVar78._20_4_ = auVar51._20_4_ * 0.0;
                auVar78._24_4_ = auVar51._24_4_ * 0.0;
                auVar78._28_4_ = 0;
                auVar51 = vminps_avx(auVar78,auVar116);
                auVar66 = vsubps_avx(auVar116,auVar74);
                local_11e0 = vblendvps_avx(auVar51,auVar66,local_1100);
                auVar51 = vsubps_avx(auVar116,auVar51);
                local_1200 = vblendvps_avx(auVar74,auVar51,local_1100);
                local_11c0 = local_14a0;
                local_1140 = local_1100;
                local_11a0[0] = local_1280._0_4_ * (float)local_1120._0_4_;
                local_11a0[1] = local_1280._4_4_ * (float)local_1120._4_4_;
                local_11a0[2] = local_1280._8_4_ * fStack_1118;
                local_11a0[3] = local_1280._12_4_ * fStack_1114;
                fStack_1190 = local_1280._16_4_ * fStack_1110;
                fStack_118c = local_1280._20_4_ * fStack_110c;
                fStack_1188 = local_1280._24_4_ * fStack_1108;
                uStack_1184 = local_1200._28_4_;
                local_1180[0] = (float)local_1120._0_4_ * local_1260._0_4_;
                local_1180[1] = (float)local_1120._4_4_ * local_1260._4_4_;
                local_1180[2] = fStack_1118 * local_1260._8_4_;
                local_1180[3] = fStack_1114 * local_1260._12_4_;
                fStack_1170 = fStack_1110 * local_1260._16_4_;
                fStack_116c = fStack_110c * local_1260._20_4_;
                fStack_1168 = fStack_1108 * local_1260._24_4_;
                uStack_1164 = auVar51._28_4_;
                local_1160[0] = (float)local_1120._0_4_ * fVar88;
                local_1160[1] = (float)local_1120._4_4_ * fVar95;
                local_1160[2] = fStack_1118 * fVar96;
                local_1160[3] = fStack_1114 * fVar97;
                fStack_1150 = fStack_1110 * fVar98;
                fStack_114c = fStack_110c * fVar99;
                fStack_1148 = fStack_1108 * fVar100;
                uStack_1144 = uStack_1104;
                auVar51 = vpmovzxwd_avx2(auVar89);
                auVar51 = vpslld_avx2(auVar51,0x1f);
                auVar79._8_4_ = 0x7f800000;
                auVar79._0_8_ = 0x7f8000007f800000;
                auVar79._12_4_ = 0x7f800000;
                auVar79._16_4_ = 0x7f800000;
                auVar79._20_4_ = 0x7f800000;
                auVar79._24_4_ = 0x7f800000;
                auVar79._28_4_ = 0x7f800000;
                auVar51 = vblendvps_avx(auVar79,local_14a0,auVar51);
                auVar74 = vshufps_avx(auVar51,auVar51,0xb1);
                auVar74 = vminps_avx(auVar51,auVar74);
                auVar66 = vshufpd_avx(auVar74,auVar74,5);
                auVar74 = vminps_avx(auVar74,auVar66);
                auVar66 = vpermpd_avx2(auVar74,0x4e);
                auVar74 = vminps_avx(auVar74,auVar66);
                auVar51 = vcmpps_avx(auVar51,auVar74,0);
                auVar80 = vpackssdw_avx(auVar51._0_16_,auVar51._16_16_);
                auVar80 = vpand_avx(auVar80,auVar89);
                _local_14e0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                pSVar43 = context->scene;
                local_1400 = local_1220;
                auVar51 = vpmovzxwd_avx2(auVar80);
                auVar51 = vpslld_avx2(auVar51,0x1f);
                if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar51 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar51 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar51 >> 0x7f,0) == '\0') &&
                      (auVar51 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar51 >> 0xbf,0) == '\0') &&
                    (auVar51 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar51[0x1f]) {
                  auVar51 = local_1220;
                }
                uVar38 = vextractps_avx(local_14e0._0_16_,1);
                uVar33 = vmovmskps_avx(auVar51);
                uVar34 = 0;
                for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x80000000) {
                  uVar34 = uVar34 + 1;
                }
                do {
                  uVar37 = CONCAT44(0,uVar34);
                  uVar34 = *(uint *)((long)&local_fc0 + uVar37 * 4);
                  pGVar4 = (pSVar43->geometries).items[uVar34].ptr;
                  if ((pGVar4->mask & uVar38) == 0) {
                    *(undefined4 *)(local_1400 + uVar37 * 4) = 0;
                  }
                  else {
                    local_1500._0_8_ = context->args;
                    if (context->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar44 = context->user;
                      if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar121 = *(float *)(local_1200 + uVar37 * 4);
                        fVar124 = *(float *)(local_11e0 + uVar37 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_11c0 + uVar37 * 4);
                        (ray->Ng).field_0.field_0.x = local_11a0[uVar37];
                        (ray->Ng).field_0.field_0.y = local_1180[uVar37];
                        (ray->Ng).field_0.field_0.z = local_1160[uVar37];
                        ray->u = fVar121;
                        ray->v = fVar124;
                        ray->primID = *(uint *)((long)&local_1300 + uVar37 * 4);
                        ray->geomID = uVar34;
                        ray->instID[0] = pRVar44->instID[0];
                        ray->instPrimID[0] = pRVar44->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar44 = context->user;
                    }
                    local_1430 = local_11a0[uVar37];
                    local_142c = local_1180[uVar37];
                    local_1428 = local_1160[uVar37];
                    local_1424 = *(undefined4 *)(local_1200 + uVar37 * 4);
                    local_1420 = *(undefined4 *)(local_11e0 + uVar37 * 4);
                    local_141c = *(undefined4 *)((long)&local_1300 + uVar37 * 4);
                    local_1418 = uVar34;
                    local_1414 = pRVar44->instID[0];
                    local_1410 = pRVar44->instPrimID[0];
                    local_13c0._0_8_ = uVar37;
                    (ray->super_RayK<1>).tfar = *(float *)(local_11c0 + uVar37 * 4);
                    local_1534 = -1;
                    local_1530.valid = &local_1534;
                    local_1530.geometryUserPtr = pGVar4->userPtr;
                    local_1530.context = pRVar44;
                    local_1530.ray = (RTCRayN *)ray;
                    local_1530.hit = (RTCHitN *)&local_1430;
                    local_1530.N = 1;
                    local_1460._0_8_ = pGVar4;
                    local_14c0._0_8_ = pSVar43;
                    if ((pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar4->intersectionFilterN)(&local_1530), *local_1530.valid != 0)) {
                      if ((*(code **)(local_1500._0_8_ + 0x10) != (code *)0x0) &&
                         ((((*(byte *)local_1500._0_8_ & 2) != 0 ||
                           ((*(byte *)(local_1460._0_8_ + 0x3e) & 0x40) != 0)) &&
                          ((**(code **)(local_1500._0_8_ + 0x10))(&local_1530),
                          *local_1530.valid == 0)))) goto LAB_0192a897;
                      (((Vec3f *)((long)local_1530.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1530.hit;
                      (((Vec3f *)((long)local_1530.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1530.hit + 4);
                      (((Vec3f *)((long)local_1530.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1530.hit + 8);
                      *(float *)((long)local_1530.ray + 0x3c) = *(float *)(local_1530.hit + 0xc);
                      *(float *)((long)local_1530.ray + 0x40) = *(float *)(local_1530.hit + 0x10);
                      *(float *)((long)local_1530.ray + 0x44) = *(float *)(local_1530.hit + 0x14);
                      *(float *)((long)local_1530.ray + 0x48) = *(float *)(local_1530.hit + 0x18);
                      *(float *)((long)local_1530.ray + 0x4c) = *(float *)(local_1530.hit + 0x1c);
                      *(float *)((long)local_1530.ray + 0x50) = *(float *)(local_1530.hit + 0x20);
                    }
                    else {
LAB_0192a897:
                      (ray->super_RayK<1>).tfar = (float)local_14e0._0_4_;
                    }
                    fVar121 = (ray->super_RayK<1>).tfar;
                    auVar52._4_4_ = fVar121;
                    auVar52._0_4_ = fVar121;
                    auVar52._8_4_ = fVar121;
                    auVar52._12_4_ = fVar121;
                    auVar52._16_4_ = fVar121;
                    auVar52._20_4_ = fVar121;
                    auVar52._24_4_ = fVar121;
                    auVar52._28_4_ = fVar121;
                    *(undefined4 *)(local_1400 + local_13c0._0_8_ * 4) = 0;
                    auVar51 = vcmpps_avx(local_14a0,auVar52,2);
                    local_1400 = vandps_avx(auVar51,local_1400);
                    uVar38 = (ray->super_RayK<1>).mask;
                    _local_14e0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                    pSVar43 = (Scene *)local_14c0._0_8_;
                  }
                  if ((((((((local_1400 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_1400 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_1400 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_1400 >> 0x7f,0) == '\0') &&
                        (local_1400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_1400 >> 0xbf,0) == '\0') &&
                      (local_1400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_1400[0x1f]) break;
                  local_14c0._0_8_ = pSVar43;
                  local_1500._0_4_ = uVar38;
                  BVHNIntersector1<4,1,true,embree::avx2::ArrayIntersector1<embree::avx2::QuadMvIntersector1Pluecker<4,true>>>
                  ::intersect(&local_1530);
                  pSVar43 = (Scene *)local_14c0._0_8_;
                  uVar34 = (uint)local_1530.valid;
                  uVar38 = local_1500._0_4_;
                } while( true );
              }
            }
            lVar42 = lVar42 + 1;
          } while (lVar42 != local_1470);
        }
        fVar121 = (ray->super_RayK<1>).tfar;
        auVar53 = ZEXT1664(CONCAT412(fVar121,CONCAT48(fVar121,CONCAT44(fVar121,fVar121))));
        auVar111 = ZEXT1664(local_1310);
        auVar117 = ZEXT1664(local_1320);
        auVar120 = ZEXT1664(local_1330);
        auVar126 = ZEXT1664(local_1350);
        auVar127 = ZEXT1664(local_1360);
        auVar133 = ZEXT1664(local_1380);
        auVar135 = ZEXT1664(local_1390);
        auVar104 = ZEXT1664(local_13d0);
        fVar121 = local_1340;
        fVar124 = fStack_133c;
        fVar125 = fStack_1338;
        auVar81._0_4_ = fStack_1334;
        fVar128 = local_1370;
        fVar130 = fStack_136c;
        fVar131 = fStack_1368;
        auVar70._0_4_ = fStack_1364;
      }
    } while (pauVar35 != (undefined1 (*) [16])&local_fa0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }